

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-internal.h
# Opt level: O0

Test * __thiscall
testing::internal::TestFactoryImpl<LimitBoneWeightsTest_testProcess_Test>::CreateTest
          (TestFactoryImpl<LimitBoneWeightsTest_testProcess_Test> *this)

{
  Test *this_00;
  TestFactoryImpl<LimitBoneWeightsTest_testProcess_Test> *this_local;
  
  this_00 = (Test *)operator_new(0x20);
  LimitBoneWeightsTest_testProcess_Test::LimitBoneWeightsTest_testProcess_Test
            ((LimitBoneWeightsTest_testProcess_Test *)this_00);
  return this_00;
}

Assistant:

virtual Test* CreateTest() { return new TestClass; }